

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * phyr::Transform::rotate(Vector3f *axis,double theta)

{
  double *in_RSI;
  Transform *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  Mat4x4 m;
  double sinTheta;
  double cosTheta;
  Transform *mat;
  Transform *in_stack_fffffffffffffee0;
  Mat4x4 *in_stack_ffffffffffffff10;
  _Mat4x4 local_a0;
  double local_20;
  double local_18;
  double local_10;
  double *local_8;
  
  mat = in_RDI;
  local_10 = in_XMM0_Qa;
  local_8 = in_RSI;
  dVar1 = radians(in_XMM0_Qa);
  local_18 = cos(dVar1);
  dVar1 = radians(local_10);
  local_20 = sin(dVar1);
  _Mat4x4::_Mat4x4(&local_a0);
  local_a0.d[0][0] = *local_8 * *local_8 * (1.0 - local_18) + local_18;
  local_a0.d[0][1] = *local_8 * local_8[1] * (1.0 - local_18) + -(local_8[2] * local_20);
  local_a0.d[0][2] = *local_8 * local_8[2] * (1.0 - local_18) + local_8[1] * local_20;
  local_a0.d[0][3] = 0.0;
  local_a0.d[1][0] = *local_8 * local_8[1] * (1.0 - local_18) + local_8[2] * local_20;
  local_a0.d[1][1] = local_8[1] * local_8[1] * (1.0 - local_18) + local_18;
  local_a0.d[1][2] = local_8[1] * local_8[2] * (1.0 - local_18) + -(*local_8 * local_20);
  local_a0.d[1][3] = 0.0;
  local_a0.d[2][0] = *local_8 * local_8[2] * (1.0 - local_18) + -(local_8[1] * local_20);
  local_a0.d[2][1] = local_8[1] * local_8[2] * (1.0 - local_18) + *local_8 * local_20;
  local_a0.d[2][2] = local_8[2] * local_8[2] * (1.0 - local_18) + local_18;
  local_a0.d[2][3] = 0.0;
  _Mat4x4::transpose(in_stack_ffffffffffffff10);
  Transform(in_stack_fffffffffffffee0,&mat->mat,&in_RDI->mat);
  return mat;
}

Assistant:

Transform Transform::rotate(const Vector3f& axis, Real theta) {
    Real cosTheta = std::cos(radians(theta));
    Real sinTheta = std::sin(radians(theta));
    Mat4x4 m;

    // Axis angle to rotation matrix
    m.d[0][0] = cosTheta + axis.x * axis.x * (1 - cosTheta);
    m.d[0][1] = axis.x * axis.y * (1 - cosTheta) - axis.z * sinTheta;
    m.d[0][2] = axis.x * axis.z * (1 - cosTheta) + axis.y * sinTheta;
    m.d[0][3] = 0;

    m.d[1][0] = axis.x * axis.y * (1 - cosTheta) + axis.z * sinTheta;
    m.d[1][1] = cosTheta + axis.y * axis.y * (1 - cosTheta);
    m.d[1][2] = axis.y * axis.z * (1 - cosTheta) - axis.x * sinTheta;
    m.d[1][3] = 0;

    m.d[2][0] = axis.x * axis.z * (1 - cosTheta) - axis.y * sinTheta;
    m.d[2][1] = axis.y * axis.z * (1 - cosTheta) + axis.x * sinTheta;
    m.d[2][2] = cosTheta + axis.z * axis.z * (1 - cosTheta);
    m.d[2][3] = 0;

    return Transform(m, Mat4x4::transpose(m));
}